

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcconn.c
# Opt level: O3

void ipc_doread(ipc_conn *c)

{
  void *pvVar1;
  nni_iov *pnVar2;
  int __fd;
  uint uVar3;
  nng_err nVar4;
  nni_aio *aio;
  ulong uVar5;
  ssize_t sVar6;
  size_t count;
  int *piVar7;
  int __count;
  long lVar8;
  undefined1 local_148 [8];
  iovec iovec [16];
  nni_iov *local_40;
  nni_iov *aiov;
  uint naiov;
  
  if ((c->closed == false) && (__fd = nni_posix_pfd_fd(&c->pfd), -1 < __fd)) {
    aio = (nni_aio *)nni_list_first(&c->readq);
    if (aio != (nni_aio *)0x0) {
      do {
        nni_aio_get_iov(aio,(uint *)((long)&aiov + 4),&local_40);
        pnVar2 = local_40;
        uVar5 = (ulong)aiov._4_4_;
        if (uVar5 < 0x11) {
          if (uVar5 == 0) {
            __count = 0;
          }
          else {
            lVar8 = 0;
            __count = 0;
            do {
              pvVar1 = *(void **)((long)&pnVar2->iov_len + lVar8);
              if (pvVar1 != (void *)0x0) {
                iovec[__count].iov_base = pvVar1;
                iovec[(long)__count + -1].iov_len = *(size_t *)((long)&pnVar2->iov_buf + lVar8);
                __count = __count + 1;
              }
              lVar8 = lVar8 + 0x10;
            } while (uVar5 << 4 != lVar8);
          }
          sVar6 = readv(__fd,(iovec *)local_148,__count);
          uVar3 = (uint)sVar6;
          if ((int)uVar3 < 0) {
            piVar7 = __errno_location();
            if (*piVar7 != 4) {
              if (*piVar7 == 0xb) {
                return;
              }
              nni_aio_list_remove(aio);
              nVar4 = nni_plat_errno(*piVar7);
              nni_aio_finish_error(aio,nVar4);
              return;
            }
          }
          else {
            if (uVar3 == 0) {
              nni_aio_list_remove(aio);
              nVar4 = NNG_ECONNSHUT;
              goto LAB_0013ac75;
            }
            nni_aio_bump_count(aio,(ulong)(uVar3 & 0x7fffffff));
            nni_aio_list_remove(aio);
            count = nni_aio_count(aio);
            nni_aio_finish(aio,NNG_OK,count);
          }
        }
        else {
          nni_aio_list_remove(aio);
          nVar4 = NNG_EINVAL;
LAB_0013ac75:
          nni_aio_finish_error(aio,nVar4);
        }
        aio = (nni_aio *)nni_list_first(&c->readq);
      } while (aio != (nni_aio *)0x0);
    }
  }
  return;
}

Assistant:

static void
ipc_doread(ipc_conn *c)
{
	nni_aio *aio;
	int      fd;

	if (c->closed || ((fd = nni_posix_pfd_fd(&c->pfd)) < 0)) {
		return;
	}

	while ((aio = nni_list_first(&c->readq)) != NULL) {
		unsigned     i;
		int          n;
		int          niov;
		unsigned     naiov;
		nni_iov     *aiov;
		struct iovec iovec[16];

		nni_aio_get_iov(aio, &naiov, &aiov);
		if (naiov > NNI_NUM_ELEMENTS(iovec)) {
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, NNG_EINVAL);
			continue;
		}
		for (niov = 0, i = 0; i < naiov; i++) {
			if (aiov[i].iov_len != 0) {
				iovec[niov].iov_len  = aiov[i].iov_len;
				iovec[niov].iov_base = aiov[i].iov_buf;
				niov++;
			}
		}

		if ((n = readv(fd, iovec, niov)) < 0) {
			switch (errno) {
			case EINTR:
				continue;
			case EAGAIN:
				return;
			default:
				nni_aio_list_remove(aio);
				nni_aio_finish_error(
				    aio, nni_plat_errno(errno));
				return;
			}
		}

		if (n == 0) {
			// Zero indicates a closed descriptor.
			// This implicitly completes this (all!) aio.
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, NNG_ECONNSHUT);
			continue;
		}

		nni_aio_bump_count(aio, n);

		// We completed the entire operation on this aio.
		nni_aio_list_remove(aio);
		nni_aio_finish(aio, 0, nni_aio_count(aio));

		// Go back to start of loop to see if there is another
		// aio ready for us to process.
	}
}